

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O2

void __thiscall
soul::heart::ProcessorInstance::ProcessorInstance(ProcessorInstance *this,CodeLocation *l)

{
  SourceCodeText *pSVar1;
  RefCountedPtr<soul::SourceCodeText> local_18;
  char *local_10;
  
  pSVar1 = (l->sourceCode).object;
  local_10 = (l->location).data;
  (l->sourceCode).object = (SourceCodeText *)0x0;
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__Object_003326f8;
  (this->super_Object).location.sourceCode.object = pSVar1;
  local_18.object = (SourceCodeText *)0x0;
  (this->super_Object).location.location.data = local_10;
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_18);
  (this->super_Object)._vptr_Object = (_func_int **)&PTR__ProcessorInstance_003336a0;
  (this->instanceName)._M_dataplus._M_p = (pointer)&(this->instanceName).field_2;
  (this->instanceName)._M_string_length = 0;
  (this->instanceName).field_2._M_local_buf[0] = '\0';
  (this->sourceName)._M_dataplus._M_p = (pointer)&(this->sourceName).field_2;
  (this->sourceName)._M_string_length = 0;
  (this->sourceName).field_2._M_local_buf[0] = '\0';
  this->arraySize = 1;
  (this->clockMultiplier).multiplier.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = false;
  (this->clockMultiplier).divider.super__Optional_base<long,_true,_true>._M_payload.
  super__Optional_payload_base<long>._M_engaged = false;
  return;
}

Assistant:

ProcessorInstance (CodeLocation l) : Object (std::move (l)) {}